

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int32_t iVar1;
  undefined4 uVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint a;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  __m256i vMaxHCol;
  __m256i vMaxHRow;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_32_cold_7();
  }
  else {
    uVar43 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_6();
    }
    else if (open < 0) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_5();
    }
    else if (gap < 0) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_table_diag_avx2_256_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_table_diag_avx2_256_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        uVar27 = (ulong)(uint)_s1Len;
        if (_s1Len < 1) {
          parasail_sg_flags_table_diag_avx2_256_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar27 = (ulong)(uint)matrix->length;
      }
      a = (uint)uVar27;
      iVar14 = a + 7;
      uVar30 = s2Len + 7;
      iVar34 = -open;
      iVar15 = matrix->min;
      uVar22 = 0x80000000 - iVar15;
      if (iVar15 != iVar34 && SBORROW4(iVar15,iVar34) == iVar15 + open < 0) {
        uVar22 = open | 0x80000000;
      }
      iVar28 = uVar22 + 1;
      iVar44 = 0x7ffffffe - matrix->max;
      iVar15 = gap * 8;
      local_260 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      local_180 = local_260;
      if (s1_beg == 0) {
        local_180._4_4_ = iVar15;
        local_180._0_4_ = iVar15;
        local_180._8_4_ = iVar15;
        local_180._12_4_ = iVar15;
        local_180._16_4_ = iVar15;
        local_180._20_4_ = iVar15;
        local_180._24_4_ = iVar15;
        local_180._28_4_ = iVar15;
      }
      local_1a0._0_8_ = CONCAT44(iVar28,iVar28);
      local_1a0._8_8_ = CONCAT44(iVar28,iVar28);
      local_1a0._16_8_ = CONCAT44(iVar28,iVar28);
      local_1a0._24_8_ = CONCAT44(iVar28,iVar28);
      local_1c0._8_8_ = local_1a0._8_8_;
      local_1c0._0_8_ = local_1a0._0_8_;
      local_1c0._16_8_ = local_1a0._16_8_;
      local_1c0._24_8_ = local_1a0._24_8_;
      local_1e0._8_8_ = local_1a0._8_8_;
      local_1e0._0_8_ = local_1a0._0_8_;
      local_1e0._16_8_ = local_1a0._16_8_;
      local_1e0._24_8_ = local_1a0._24_8_;
      local_240._8_8_ = local_1a0._8_8_;
      local_240._0_8_ = local_1a0._0_8_;
      local_240._16_8_ = local_1a0._16_8_;
      local_240._24_8_ = local_1a0._24_8_;
      local_200._8_8_ = local_1a0._8_8_;
      local_200._0_8_ = local_1a0._0_8_;
      local_200._16_8_ = local_1a0._16_8_;
      local_200._24_8_ = local_1a0._24_8_;
      if (s1_beg == 0) {
        auVar50 = vpinsrd_avx(ZEXT416((uint)-(gap * 3 + open)),iVar34 + gap * -2,1);
        auVar50 = vpinsrd_avx(auVar50,iVar34 - gap,2);
        auVar50 = vpinsrd_avx(auVar50,iVar34,3);
        auVar5 = vpinsrd_avx(ZEXT416((uint)(gap * -7 - open)),-(gap * 6 + open),1);
        auVar5 = vpinsrd_avx(auVar5,-(gap * 5 + open),2);
        auVar5 = vpinsrd_avx(auVar5,iVar34 + gap * -4,3);
        local_260._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar5;
        local_260._16_16_ = ZEXT116(1) * auVar50;
      }
      auVar50 = in_ZMM8._0_16_;
      ppVar18 = parasail_result_new_table1(a,s2Len);
      if (ppVar18 != (parasail_result_t *)0x0) {
        ppVar18->flag =
             (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
             (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x8421002;
        uVar23 = (ulong)(s2Len + 0xe);
        ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar23);
        ptr_00 = parasail_memalign_int32_t(0x20,uVar23);
        ptr_01 = parasail_memalign_int32_t(0x20,uVar23);
        if (ptr_01 != (int32_t *)0x0 &&
            (ptr_00 != (int32_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            ptr_02 = parasail_memalign_int32_t(0x20,(long)iVar14);
            if (ptr_02 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)a) {
              piVar3 = matrix->mapper;
              uVar23 = 0;
              do {
                ptr_02[uVar23] = piVar3[(byte)_s1[uVar23]];
                uVar23 = uVar23 + 1;
              } while (uVar27 != uVar23);
            }
            iVar15 = a + 1;
            if ((int)(a + 1) < iVar14) {
              iVar15 = iVar14;
            }
            memset(ptr_02 + (int)a,0,(ulong)(~a + iVar15) * 4 + 4);
          }
          else {
            ptr_02 = (int32_t *)0x0;
          }
          local_80._4_4_ = a;
          local_80._0_4_ = a;
          local_80._8_4_ = a;
          local_80._12_4_ = a;
          local_80._16_4_ = a;
          local_80._20_4_ = a;
          local_80._24_4_ = a;
          local_80._28_4_ = a;
          auVar45 = vpcmpeqd_avx2(ZEXT432(a),ZEXT432(a));
          local_a0._4_4_ = s2Len;
          local_a0._0_4_ = s2Len;
          local_a0._8_4_ = s2Len;
          local_a0._12_4_ = s2Len;
          local_a0._16_4_ = s2Len;
          local_a0._20_4_ = s2Len;
          local_a0._24_4_ = s2Len;
          local_a0._28_4_ = s2Len;
          local_120 = vpaddd_avx2(local_80,auVar45);
          local_100 = vpaddd_avx2(local_a0,auVar45);
          piVar3 = matrix->mapper;
          uVar23 = 1;
          if (1 < s2Len) {
            uVar23 = (ulong)(uint)s2Len;
          }
          uVar26 = 0;
          do {
            *(int *)(ptr[1] + uVar26 * 4 + 0xc) = piVar3[(byte)_s2[uVar26]];
            uVar26 = uVar26 + 1;
          } while (uVar23 != uVar26);
          *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar22 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar30) {
            uVar22 = uVar30;
          }
          auVar45 = ZEXT1632(auVar50);
          local_220 = iVar44;
          iStack_21c = iVar44;
          iStack_218 = iVar44;
          iStack_214 = iVar44;
          iStack_210 = iVar44;
          iStack_20c = iVar44;
          iStack_208 = iVar44;
          iStack_204 = iVar44;
          local_e0 = gap;
          iStack_dc = gap;
          iStack_d8 = gap;
          iStack_d4 = gap;
          iStack_d0 = gap;
          iStack_cc = gap;
          iStack_c8 = gap;
          iStack_c4 = gap;
          local_c0 = open;
          iStack_bc = open;
          iStack_b8 = open;
          iStack_b4 = open;
          iStack_b0 = open;
          iStack_ac = open;
          iStack_a8 = open;
          iStack_a4 = open;
          memset(ptr[1] + uVar43 * 4 + 0xc,0,(ulong)(~s2Len + uVar22) * 4 + 4);
          uVar23 = 1;
          if (1 < s2Len) {
            uVar23 = (ulong)(uint)s2Len;
          }
          uVar26 = 0;
          iVar15 = iVar34;
          if (s2_beg == 0) {
            do {
              ptr_00[uVar26 + 7] = iVar15;
              ptr_01[uVar26 + 7] = iVar28;
              uVar26 = uVar26 + 1;
              iVar15 = iVar15 - gap;
            } while (uVar23 != uVar26);
          }
          else {
            do {
              ptr_00[uVar26 + 7] = 0;
              ptr_01[uVar26 + 7] = iVar28;
              uVar26 = uVar26 + 1;
            } while (uVar23 != uVar26);
          }
          lVar19 = 0;
          do {
            ptr_00[lVar19] = iVar28;
            ptr_01[lVar19] = iVar28;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 7);
          lVar19 = uVar43 + 7;
          uVar23 = uVar43;
          do {
            ptr_00[lVar19] = iVar28;
            ptr_01[lVar19] = iVar28;
            lVar19 = lVar19 + 1;
            uVar22 = (int)uVar23 + 1;
            uVar23 = (ulong)uVar22;
          } while ((int)uVar22 < (int)uVar30);
          ptr_00[6] = 0;
          auVar47 = ZEXT3264(local_1e0);
          auVar48 = ZEXT3264(local_240);
          auVar54 = ZEXT3264(local_200);
          if ((int)a < 1) {
            local_2a0._4_4_ = iVar28;
            local_2a0._0_4_ = iVar28;
            local_2a0._12_4_ = iVar28;
            local_2a0._8_4_ = iVar28;
            local_2a0._20_4_ = iVar28;
            local_2a0._16_4_ = iVar28;
            local_2a0._28_4_ = iVar28;
            local_2a0._24_4_ = iVar28;
            local_280._4_4_ = iStack_21c;
            local_280._0_4_ = local_220;
            local_280._12_4_ = iStack_214;
            local_280._8_4_ = iStack_218;
            local_280._20_4_ = iStack_20c;
            local_280._16_4_ = iStack_210;
            local_280._28_4_ = iStack_204;
            local_280._24_4_ = iStack_208;
          }
          else {
            piVar3 = matrix->matrix;
            uVar22 = a - 1;
            local_2a0._4_4_ = iVar28;
            local_2a0._0_4_ = iVar28;
            local_2a0._8_4_ = iVar28;
            local_2a0._12_4_ = iVar28;
            local_2a0._16_4_ = iVar28;
            local_2a0._20_4_ = iVar28;
            local_2a0._24_4_ = iVar28;
            local_2a0._28_4_ = iVar28;
            local_140 = vpalignr_avx2(ZEXT1632(local_2a0._16_16_),local_2a0,4);
            uVar23 = 1;
            if (1 < (int)uVar30) {
              uVar23 = (ulong)uVar30;
            }
            lVar19 = uVar43 * 0x20;
            local_368 = uVar43 * 4 + -4;
            local_378 = uVar43 * 0x1c + -0x1c;
            local_380 = uVar43 * 0x18 + -0x18;
            local_388 = uVar43 * 0x14 + -0x14;
            local_390 = uVar43 * 8 + -8;
            local_398 = uVar43 * 0x10 + -0x10;
            local_3a0 = uVar43 * 0xc + -0xc;
            local_2c0._8_8_ = 0x400000005;
            local_2c0._0_8_ = 0x600000007;
            local_2c0._16_8_ = 0x200000003;
            local_2c0._24_8_ = 1;
            auVar45 = vpcmpeqd_avx2(auVar45,auVar45);
            auVar51 = ZEXT3264(auVar45);
            local_160 = 8;
            uStack_15c = 8;
            uStack_158 = 8;
            uStack_154 = 8;
            uStack_150 = 8;
            uStack_14c = 8;
            uStack_148 = 8;
            uStack_144 = 8;
            local_280._4_4_ = iStack_21c;
            local_280._0_4_ = local_220;
            local_280._12_4_ = iStack_214;
            local_280._8_4_ = iStack_218;
            local_280._20_4_ = iStack_20c;
            local_280._16_4_ = iStack_210;
            local_280._28_4_ = iStack_204;
            local_280._24_4_ = iStack_208;
            local_370 = 0;
            uVar26 = 0;
            do {
              iVar15 = matrix->type;
              uVar25 = (uint)uVar26;
              uVar30 = uVar25;
              if (iVar15 == 0) {
                uVar30 = ptr_02[uVar26];
              }
              uVar24 = uVar26 | 1;
              if (iVar15 == 0) {
                uVar31 = ptr_02[uVar24];
              }
              else {
                uVar31 = uVar22;
                if (uVar24 < uVar27) {
                  uVar31 = uVar25 | 1;
                }
              }
              uVar33 = uVar26 | 2;
              if (iVar15 == 0) {
                uVar35 = ptr_02[uVar33];
              }
              else {
                uVar35 = uVar22;
                if (uVar33 < uVar27) {
                  uVar35 = uVar25 | 2;
                }
              }
              uVar38 = uVar26 | 3;
              if (iVar15 == 0) {
                uVar39 = ptr_02[uVar38];
              }
              else {
                uVar39 = uVar22;
                if (uVar38 < uVar27) {
                  uVar39 = uVar25 | 3;
                }
              }
              uVar40 = uVar26 | 4;
              if (iVar15 == 0) {
                uVar36 = ptr_02[uVar40];
              }
              else {
                uVar36 = uVar22;
                if (uVar40 < uVar27) {
                  uVar36 = uVar25 | 4;
                }
              }
              uVar41 = uVar26 | 5;
              if (iVar15 == 0) {
                uVar37 = ptr_02[uVar41];
              }
              else {
                uVar37 = uVar22;
                if (uVar41 < uVar27) {
                  uVar37 = uVar25 | 5;
                }
              }
              uVar42 = uVar26 | 6;
              if (iVar15 == 0) {
                uVar16 = ptr_02[uVar42];
              }
              else {
                uVar16 = uVar22;
                if (uVar42 < uVar27) {
                  uVar16 = uVar25 | 6;
                }
              }
              iVar14 = matrix->size;
              uVar20 = uVar26 | 7;
              if (iVar15 == 0) {
                uVar32 = ptr_02[uVar20];
              }
              else {
                uVar32 = uVar22;
                if (uVar20 < uVar27) {
                  uVar32 = uVar25 | 7;
                }
              }
              uVar26 = uVar26 + 8;
              iVar15 = iVar34 - uVar25 * gap;
              iVar1 = ptr_00[6];
              auVar45._4_4_ = iVar1;
              auVar45._0_4_ = iVar1;
              auVar45._8_4_ = iVar1;
              auVar45._12_4_ = iVar1;
              auVar45._16_4_ = iVar1;
              auVar45._20_4_ = iVar1;
              auVar45._24_4_ = iVar1;
              auVar45._28_4_ = iVar1;
              ptr_00[6] = iVar34 - (int)uVar26 * gap;
              if (s1_beg != 0) {
                iVar15 = 0;
              }
              auVar49._4_4_ = iVar15;
              auVar49._0_4_ = iVar15;
              auVar49._8_4_ = iVar15;
              auVar49._12_4_ = iVar15;
              auVar49._16_4_ = iVar15;
              auVar49._20_4_ = iVar15;
              auVar49._24_4_ = iVar15;
              auVar49._28_4_ = iVar15;
              auVar49 = vpblendd_avx2(local_140,auVar49,0x80);
              auVar53 = vpblendd_avx2(local_140,auVar45,0x80);
              auVar6 = vpcmpeqd_avx2(local_2c0,local_120);
              uVar21 = 0;
              auVar9 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
              auVar11._4_4_ = iVar28;
              auVar11._0_4_ = iVar28;
              auVar11._8_4_ = iVar28;
              auVar11._12_4_ = iVar28;
              auVar11._16_4_ = iVar28;
              auVar11._20_4_ = iVar28;
              auVar11._24_4_ = iVar28;
              auVar11._28_4_ = iVar28;
              auVar45 = auVar11;
              do {
                auVar50 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar39 * iVar14) +
                                                           (long)*(int *)(ptr[1] + uVar21 * 4)]),
                                      piVar3[(long)(int)(uVar35 * iVar14) +
                                             (long)*(int *)(ptr[1] + uVar21 * 4 + 4)],1);
                auVar50 = vpinsrd_avx(auVar50,piVar3[(long)(int)(uVar31 * iVar14) +
                                                     (long)*(int *)(ptr[1] + uVar21 * 4 + 8)],2);
                auVar50 = vpinsrd_avx(auVar50,piVar3[(long)(int)(uVar30 * iVar14) +
                                                     (long)*(int *)(ptr[1] + uVar21 * 4 + 0xc)],3);
                auVar5 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar32 * iVar14) +
                                                          (long)*(int *)(*ptr + uVar21 * 4)]),
                                     piVar3[(long)(int)(uVar16 * iVar14) +
                                            (long)*(int *)(*ptr + uVar21 * 4 + 4)],1);
                auVar5 = vpinsrd_avx(auVar5,piVar3[(long)(int)(uVar37 * iVar14) +
                                                   (long)*(int *)(*ptr + uVar21 * 4 + 8)],2);
                auVar5 = vpinsrd_avx(auVar5,piVar3[(long)(int)(uVar36 * iVar14) +
                                                   (long)*(int *)(*ptr + uVar21 * 4 + 0xc)],3);
                auVar46._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar5;
                auVar46._16_16_ = ZEXT116(1) * auVar50;
                auVar52 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
                auVar10 = vpermd_avx2(auVar52,auVar49);
                auVar46 = vpaddd_avx2(auVar53,auVar46);
                iVar1 = ptr_00[uVar21 + 7];
                auVar53._4_4_ = iVar1;
                auVar53._0_4_ = iVar1;
                auVar53._8_4_ = iVar1;
                auVar53._12_4_ = iVar1;
                auVar53._16_4_ = iVar1;
                auVar53._20_4_ = iVar1;
                auVar53._24_4_ = iVar1;
                auVar53._28_4_ = iVar1;
                auVar53 = vpblendd_avx2(auVar10,auVar53,0x80);
                auVar11 = vpermd_avx2(auVar52,auVar11);
                iVar1 = ptr_01[uVar21 + 7];
                auVar52._4_4_ = iVar1;
                auVar52._0_4_ = iVar1;
                auVar52._8_4_ = iVar1;
                auVar52._12_4_ = iVar1;
                auVar52._16_4_ = iVar1;
                auVar52._20_4_ = iVar1;
                auVar52._24_4_ = iVar1;
                auVar52._28_4_ = iVar1;
                auVar52 = vpblendd_avx2(auVar11,auVar52,0x80);
                auVar7._4_4_ = iStack_bc;
                auVar7._0_4_ = local_c0;
                auVar7._8_4_ = iStack_b8;
                auVar7._12_4_ = iStack_b4;
                auVar7._16_4_ = iStack_b0;
                auVar7._20_4_ = iStack_ac;
                auVar7._24_4_ = iStack_a8;
                auVar7._28_4_ = iStack_a4;
                auVar11 = vpsubd_avx2(auVar53,auVar7);
                auVar10._4_4_ = iStack_dc;
                auVar10._0_4_ = local_e0;
                auVar10._8_4_ = iStack_d8;
                auVar10._12_4_ = iStack_d4;
                auVar10._16_4_ = iStack_d0;
                auVar10._20_4_ = iStack_cc;
                auVar10._24_4_ = iStack_c8;
                auVar10._28_4_ = iStack_c4;
                auVar52 = vpsubd_avx2(auVar52,auVar10);
                auVar11 = vpmaxsd_avx2(auVar11,auVar52);
                auVar49 = vpsubd_avx2(auVar49,auVar7);
                auVar45 = vpsubd_avx2(auVar45,auVar10);
                auVar52 = vpmaxsd_avx2(auVar49,auVar45);
                auVar45 = vpmaxsd_avx2(auVar52,auVar11);
                auVar46 = vpmaxsd_avx2(auVar46,auVar45);
                auVar45 = vpcmpeqd_avx2(auVar9,auVar51._0_32_);
                auVar49 = vblendvps_avx(auVar46,local_260,auVar45);
                if (7 < uVar21) {
                  local_280 = vpminsd_avx2(local_280,auVar49);
                  local_2a0 = vpmaxsd_avx2(local_2a0,auVar49);
                }
                piVar4 = ((ppVar18->field_4).rowcols)->score_row;
                auVar50 = auVar49._16_16_;
                if (uVar21 < uVar43) {
                  uVar2 = vextractps_avx(auVar50,3);
                  *(undefined4 *)((long)piVar4 + uVar21 * 4 + local_370) = uVar2;
                }
                if (uVar21 - 1 < uVar43 && uVar24 < uVar27) {
                  uVar2 = vextractps_avx(auVar50,2);
                  *(undefined4 *)((long)piVar4 + uVar21 * 4 + local_368) = uVar2;
                }
                if ((uVar33 < uVar27) && ((long)(uVar21 - 2) < (long)uVar43 && 1 < uVar21)) {
                  uVar2 = vextractps_avx(auVar50,1);
                  *(undefined4 *)((long)piVar4 + uVar21 * 4 + local_390) = uVar2;
                }
                if ((uVar38 < uVar27) && ((long)(uVar21 - 3) < (long)uVar43 && 2 < uVar21)) {
                  *(int *)((long)piVar4 + uVar21 * 4 + local_3a0) = auVar49._16_4_;
                }
                if ((uVar40 < uVar27) && ((long)(uVar21 - 4) < (long)uVar43 && 3 < uVar21)) {
                  *(int *)((long)piVar4 + uVar21 * 4 + local_398) = auVar49._12_4_;
                }
                if ((uVar41 < uVar27) && ((long)(uVar21 - 5) < (long)uVar43 && 4 < uVar21)) {
                  *(int *)((long)piVar4 + uVar21 * 4 + local_388) = auVar49._8_4_;
                }
                if ((uVar42 < uVar27) && ((long)(uVar21 - 6) < (long)uVar43 && 5 < uVar21)) {
                  *(int *)((long)piVar4 + uVar21 * 4 + local_380) = auVar49._4_4_;
                }
                auVar8._4_4_ = iVar28;
                auVar8._0_4_ = iVar28;
                auVar8._8_4_ = iVar28;
                auVar8._12_4_ = iVar28;
                auVar8._16_4_ = iVar28;
                auVar8._20_4_ = iVar28;
                auVar8._24_4_ = iVar28;
                auVar8._28_4_ = iVar28;
                auVar11 = vblendvps_avx(auVar11,auVar8,auVar45);
                if ((uVar20 < uVar27) && ((long)(uVar21 - 7) < (long)uVar43 && 6 < uVar21)) {
                  *(int32_t *)((long)piVar4 + uVar21 * 4 + local_378) = auVar49._0_4_;
                }
                auVar12._4_4_ = iVar28;
                auVar12._0_4_ = iVar28;
                auVar12._8_4_ = iVar28;
                auVar12._12_4_ = iVar28;
                auVar12._16_4_ = iVar28;
                auVar12._20_4_ = iVar28;
                auVar12._24_4_ = iVar28;
                auVar12._28_4_ = iVar28;
                auVar45 = vblendvps_avx(auVar52,auVar12,auVar45);
                ptr_00[uVar21] = auVar49._0_4_;
                ptr_01[uVar21] = auVar11._0_4_;
                auVar10 = vpcmpgtd_avx2(local_80,local_2c0);
                auVar7 = vpcmpeqd_avx2(auVar9,local_100);
                auVar52 = vpcmpgtd_avx2(local_a0,auVar9);
                auVar8 = vpcmpgtd_avx2(auVar49,local_1a0);
                auVar52 = vpandn_avx2(auVar9,auVar52);
                auVar52 = vpand_avx2(auVar52,auVar6);
                auVar52 = vpand_avx2(auVar8,auVar52);
                auVar8 = vpcmpgtd_avx2(auVar49,local_1c0);
                auVar10 = vpand_avx2(auVar7,auVar10);
                auVar10 = vpand_avx2(auVar8,auVar10);
                local_1a0 = vblendvps_avx(local_1a0,auVar46,auVar52);
                local_1c0 = vblendvps_avx(local_1c0,auVar49,auVar10);
                auVar46 = vpand_avx2(auVar7,auVar6);
                local_1e0 = vblendvps_avx(auVar47._0_32_,auVar49,auVar46);
                auVar47 = ZEXT3264(local_1e0);
                local_240 = vblendvps_avx(auVar48._0_32_,local_2c0,auVar10);
                auVar48 = ZEXT3264(local_240);
                local_200 = vblendvps_avx(auVar54._0_32_,auVar9,auVar52);
                auVar54 = ZEXT3264(local_200);
                auVar46 = vpcmpeqd_avx2(local_1a0,local_1a0);
                auVar51 = ZEXT3264(auVar46);
                auVar9 = vpsubd_avx2(auVar9,auVar46);
                uVar21 = uVar21 + 1;
              } while (uVar23 != uVar21);
              auVar6._8_4_ = 8;
              auVar6._0_8_ = 0x800000008;
              auVar6._12_4_ = 8;
              auVar6._16_4_ = 8;
              auVar6._20_4_ = 8;
              auVar6._24_4_ = 8;
              auVar6._28_4_ = 8;
              local_2c0 = vpaddd_avx2(local_2c0,auVar6);
              local_260 = vpsubd_avx2(local_260,local_180);
              local_370 = local_370 + lVar19;
              local_368 = local_368 + lVar19;
              local_378 = local_378 + lVar19;
              local_380 = local_380 + lVar19;
              local_388 = local_388 + lVar19;
              local_398 = local_398 + lVar19;
              local_3a0 = local_3a0 + lVar19;
              local_390 = local_390 + lVar19;
            } while (uVar26 < uVar27);
          }
          lVar19 = 0;
          iVar15 = 0;
          iVar14 = 0;
          iVar34 = iVar28;
          iVar44 = iVar28;
          iVar29 = iVar28;
          do {
            iVar17 = *(int *)(local_1c0 + lVar19 * 4);
            if ((iVar44 < iVar17) ||
               ((iVar17 == iVar44 && (*(int *)(local_240 + lVar19 * 4) < iVar15)))) {
              iVar15 = *(int *)(local_240 + lVar19 * 4);
              iVar44 = iVar17;
            }
            if (iVar29 < *(int *)(local_1a0 + lVar19 * 4)) {
              iVar14 = *(int *)(local_200 + lVar19 * 4);
              iVar29 = *(int *)(local_1a0 + lVar19 * 4);
            }
            if (iVar34 < *(int *)(local_1e0 + lVar19 * 4)) {
              iVar34 = *(int *)(local_1e0 + lVar19 * 4);
            }
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 8);
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end == 0) {
              iVar15 = a - 1;
              iVar17 = s2Len + -1;
              if (s2_end != 0) {
                iVar17 = iVar14;
                iVar34 = iVar29;
              }
            }
            else {
              iVar17 = s2Len + -1;
              iVar34 = iVar44;
            }
          }
          else if ((iVar29 < iVar44) || (s2Len + -1 == iVar14 && iVar44 == iVar29)) {
            iVar17 = s2Len + -1;
            iVar34 = iVar44;
          }
          else {
            iVar15 = a - 1;
            iVar17 = iVar14;
            iVar34 = iVar29;
          }
          auVar9._4_4_ = iVar28;
          auVar9._0_4_ = iVar28;
          auVar9._8_4_ = iVar28;
          auVar9._12_4_ = iVar28;
          auVar9._16_4_ = iVar28;
          auVar9._20_4_ = iVar28;
          auVar9._24_4_ = iVar28;
          auVar9._28_4_ = iVar28;
          auVar45 = vpcmpgtd_avx2(auVar9,local_280);
          auVar13._4_4_ = iStack_21c;
          auVar13._0_4_ = local_220;
          auVar13._8_4_ = iStack_218;
          auVar13._12_4_ = iStack_214;
          auVar13._16_4_ = iStack_210;
          auVar13._20_4_ = iStack_20c;
          auVar13._24_4_ = iStack_208;
          auVar13._28_4_ = iStack_204;
          auVar49 = vpcmpgtd_avx2(local_2a0,auVar13);
          auVar45 = vpor_avx2(auVar45,auVar49);
          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar45 >> 0x7f,0) != '\0') ||
                (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar45 >> 0xbf,0) != '\0') ||
              (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar45[0x1f] < '\0') {
            *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
            iVar34 = 0;
            iVar17 = 0;
            iVar15 = 0;
          }
          ppVar18->score = iVar34;
          ppVar18->end_query = iVar15;
          ppVar18->end_ref = iVar17;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar18;
          }
          return ppVar18;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = s1_beg ? _mm256_set1_epi32(0) : _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi32(0) : _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi32(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi32(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi32_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi32(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi32(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}